

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O2

int Gia_ObjToLit(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  
  iVar1 = Gia_ObjId(p,(Gia_Obj_t *)((ulong)pObj & 0xfffffffffffffffe));
  iVar1 = Abc_Var2Lit(iVar1,(uint)pObj & 1);
  return iVar1;
}

Assistant:

static inline int          Gia_ObjToLit( Gia_Man_t * p, Gia_Obj_t * pObj )     { return Abc_Var2Lit( Gia_ObjId(p, Gia_Regular(pObj)), Gia_IsComplement(pObj) ); }